

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

ShMem * __thiscall amrex::FabArray<amrex::FArrayBox>::ShMem::operator=(ShMem *this,ShMem *rhs)

{
  ShMem *rhs_local;
  ShMem *this_local;
  
  if (rhs != this) {
    this->alloc = (bool)(rhs->alloc & 1);
    this->n_values = rhs->n_values;
    this->n_points = rhs->n_points;
    rhs->alloc = false;
  }
  return this;
}

Assistant:

ShMem& operator= (ShMem&& rhs) noexcept {
            if (&rhs != this) {
                alloc = rhs.alloc;
                n_values = rhs.n_values;
                n_points = rhs.n_points;
                rhs.alloc = false;
#if defined(BL_USE_MPI3)
                win = rhs.win;
                rhs.win = MPI_WIN_NULL;
#endif
            }
            return *this;
        }